

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastunpack30_32(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = *in;
  *out = uVar1 & 0x3fffffff;
  out[1] = uVar1 >> 0x1e;
  uVar2 = in[1];
  out[1] = uVar1 >> 0x1e | (uVar2 & 0xfffffff) << 2;
  out[2] = uVar2 >> 0x1c;
  uVar1 = in[2];
  out[2] = uVar2 >> 0x1c | (uVar1 & 0x3ffffff) << 4;
  uVar2 = in[3];
  out[3] = uVar1 >> 0x1a;
  out[3] = uVar1 >> 0x1a | (uVar2 & 0xffffff) << 6;
  out[4] = uVar2 >> 0x18;
  uVar1 = in[4];
  out[4] = uVar2 >> 0x18 | (uVar1 & 0x3fffff) << 8;
  out[5] = uVar1 >> 0x16;
  uVar2 = in[5];
  out[5] = uVar1 >> 0x16 | (uVar2 & 0xfffff) << 10;
  uVar1 = in[6];
  out[6] = uVar2 >> 0x14;
  out[6] = uVar2 >> 0x14 | (uVar1 & 0x3ffff) << 0xc;
  out[7] = uVar1 >> 0x12;
  uVar2 = in[7];
  out[7] = uVar1 >> 0x12 | (uVar2 & 0xffff) << 0xe;
  out[8] = uVar2 >> 0x10;
  uVar1 = in[8];
  out[8] = uVar2 >> 0x10 | (uVar1 & 0x3fff) << 0x10;
  uVar2 = in[9];
  out[9] = uVar1 >> 0xe;
  out[9] = uVar1 >> 0xe | (uVar2 & 0xfff) << 0x12;
  out[10] = uVar2 >> 0xc;
  uVar1 = in[10];
  out[10] = uVar2 >> 0xc | (uVar1 & 0x3ff) << 0x14;
  out[0xb] = uVar1 >> 10;
  uVar2 = in[0xb];
  out[0xb] = uVar1 >> 10 | (uVar2 & 0xff) << 0x16;
  uVar1 = in[0xc];
  out[0xc] = uVar2 >> 8;
  out[0xc] = uVar2 >> 8 | (uVar1 & 0x3f) << 0x18;
  out[0xd] = uVar1 >> 6;
  uVar2 = in[0xd];
  out[0xd] = uVar1 >> 6 | (uVar2 & 0xf) << 0x1a;
  out[0xe] = uVar2 >> 4;
  uVar1 = in[0xe];
  out[0xe] = uVar2 >> 4 | (uVar1 & 3) << 0x1c;
  out[0xf] = uVar1 >> 2;
  uVar1 = in[0xf];
  out[0x10] = uVar1 & 0x3fffffff;
  uVar2 = in[0x10];
  out[0x11] = uVar1 >> 0x1e;
  out[0x11] = uVar1 >> 0x1e | (uVar2 & 0xfffffff) << 2;
  out[0x12] = uVar2 >> 0x1c;
  uVar1 = in[0x11];
  out[0x12] = uVar2 >> 0x1c | (uVar1 & 0x3ffffff) << 4;
  out[0x13] = uVar1 >> 0x1a;
  uVar2 = in[0x12];
  out[0x13] = uVar1 >> 0x1a | (uVar2 & 0xffffff) << 6;
  uVar1 = in[0x13];
  out[0x14] = uVar2 >> 0x18;
  out[0x14] = uVar2 >> 0x18 | (uVar1 & 0x3fffff) << 8;
  out[0x15] = uVar1 >> 0x16;
  uVar2 = in[0x14];
  out[0x15] = uVar1 >> 0x16 | (uVar2 & 0xfffff) << 10;
  out[0x16] = uVar2 >> 0x14;
  uVar1 = in[0x15];
  out[0x16] = uVar2 >> 0x14 | (uVar1 & 0x3ffff) << 0xc;
  uVar2 = in[0x16];
  out[0x17] = uVar1 >> 0x12;
  out[0x17] = uVar1 >> 0x12 | (uVar2 & 0xffff) << 0xe;
  out[0x18] = uVar2 >> 0x10;
  uVar1 = in[0x17];
  out[0x18] = uVar2 >> 0x10 | (uVar1 & 0x3fff) << 0x10;
  out[0x19] = uVar1 >> 0xe;
  uVar2 = in[0x18];
  out[0x19] = uVar1 >> 0xe | (uVar2 & 0xfff) << 0x12;
  uVar1 = in[0x19];
  out[0x1a] = uVar2 >> 0xc;
  out[0x1a] = uVar2 >> 0xc | (uVar1 & 0x3ff) << 0x14;
  out[0x1b] = uVar1 >> 10;
  uVar2 = in[0x1a];
  out[0x1b] = uVar1 >> 10 | (uVar2 & 0xff) << 0x16;
  out[0x1c] = uVar2 >> 8;
  uVar1 = in[0x1b];
  out[0x1c] = uVar2 >> 8 | (uVar1 & 0x3f) << 0x18;
  uVar2 = in[0x1c];
  out[0x1d] = uVar1 >> 6;
  out[0x1d] = uVar1 >> 6 | (uVar2 & 0xf) << 0x1a;
  out[0x1e] = uVar2 >> 4;
  uVar1 = in[0x1d];
  out[0x1e] = uVar2 >> 4 | (uVar1 & 3) << 0x1c;
  out[0x1f] = uVar1 >> 2;
  return in + 0x1e;
}

Assistant:

const uint32_t *__fastunpack30_32(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 30);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 28)) << (30 - 28);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 26)) << (30 - 26);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 24)) << (30 - 24);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 22)) << (30 - 22);
  out++;
  *out = ((*in) >> 22);
  ++in;
  *out |= ((*in) % (1U << 20)) << (30 - 20);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 18)) << (30 - 18);
  out++;
  *out = ((*in) >> 18);
  ++in;
  *out |= ((*in) % (1U << 16)) << (30 - 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  *out |= ((*in) % (1U << 14)) << (30 - 14);
  out++;
  *out = ((*in) >> 14);
  ++in;
  *out |= ((*in) % (1U << 12)) << (30 - 12);
  out++;
  *out = ((*in) >> 12);
  ++in;
  *out |= ((*in) % (1U << 10)) << (30 - 10);
  out++;
  *out = ((*in) >> 10);
  ++in;
  *out |= ((*in) % (1U << 8)) << (30 - 8);
  out++;
  *out = ((*in) >> 8);
  ++in;
  *out |= ((*in) % (1U << 6)) << (30 - 6);
  out++;
  *out = ((*in) >> 6);
  ++in;
  *out |= ((*in) % (1U << 4)) << (30 - 4);
  out++;
  *out = ((*in) >> 4);
  ++in;
  *out |= ((*in) % (1U << 2)) << (30 - 2);
  out++;
  *out = ((*in) >> 2);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 30);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 28)) << (30 - 28);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 26)) << (30 - 26);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 24)) << (30 - 24);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 22)) << (30 - 22);
  out++;
  *out = ((*in) >> 22);
  ++in;
  *out |= ((*in) % (1U << 20)) << (30 - 20);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 18)) << (30 - 18);
  out++;
  *out = ((*in) >> 18);
  ++in;
  *out |= ((*in) % (1U << 16)) << (30 - 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  *out |= ((*in) % (1U << 14)) << (30 - 14);
  out++;
  *out = ((*in) >> 14);
  ++in;
  *out |= ((*in) % (1U << 12)) << (30 - 12);
  out++;
  *out = ((*in) >> 12);
  ++in;
  *out |= ((*in) % (1U << 10)) << (30 - 10);
  out++;
  *out = ((*in) >> 10);
  ++in;
  *out |= ((*in) % (1U << 8)) << (30 - 8);
  out++;
  *out = ((*in) >> 8);
  ++in;
  *out |= ((*in) % (1U << 6)) << (30 - 6);
  out++;
  *out = ((*in) >> 6);
  ++in;
  *out |= ((*in) % (1U << 4)) << (30 - 4);
  out++;
  *out = ((*in) >> 4);
  ++in;
  *out |= ((*in) % (1U << 2)) << (30 - 2);
  out++;
  *out = ((*in) >> 2);
  ++in;
  out++;

  return in;
}